

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

int ssl_load_buffered_message(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *pmVar1;
  char *pcVar2;
  mbedtls_ssl_hs_buffer *pmVar3;
  long lVar4;
  size_t msg_len;
  uint offset;
  int ret;
  mbedtls_ssl_hs_buffer *hs_buf;
  mbedtls_ssl_handshake_params *hs;
  mbedtls_ssl_context *ssl_local;
  
  pmVar1 = ssl->handshake;
  msg_len._4_4_ = 0;
  if (pmVar1 == (mbedtls_ssl_handshake_params *)0x0) {
    ssl_local._4_4_ = -1;
  }
  else {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x107d,"=> ssl_load_buffered_message");
    if ((ssl->state == 10) || (ssl->state == 0xc)) {
      if ((pmVar1->buffering).seen_ccs == '\0') {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x1084,"CCS not seen in the current flight");
        msg_len._4_4_ = -1;
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x1089,"Injecting buffered CCS message");
        ssl->in_msgtype = 0x14;
        ssl->in_msglen = 1;
        *ssl->in_msg = '\x01';
        ssl->in_left = 0;
        ssl->next_record_offset = 0;
        (pmVar1->buffering).seen_ccs = '\0';
      }
    }
    else {
      for (msg_len._0_4_ = 1; (uint)msg_len < 4; msg_len._0_4_ = (uint)msg_len + 1) {
        pmVar3 = (pmVar1->buffering).hs + (uint)msg_len;
        if ((undefined1  [24])((undefined1  [24])*pmVar3 & (undefined1  [24])0x1) ==
            (undefined1  [24])0x1) {
          pcVar2 = "partially";
          if ((*(byte *)pmVar3 >> 2 & 1) != 0) {
            pcVar2 = "fully";
          }
          mbedtls_debug_print_msg
                    (ssl,2,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x109f,"Future message with sequence number %u %s buffered.",
                     (ulong)(pmVar1->in_msg_seq + (uint)msg_len),pcVar2);
        }
      }
      pmVar3 = (pmVar1->buffering).hs;
      if (((undefined1  [24])((undefined1  [24])*pmVar3 & (undefined1  [24])0x1) ==
           (undefined1  [24])0x1) && ((*(byte *)pmVar3 >> 2 & 1) == 1)) {
        lVar4 = (long)(int)((uint)(pmVar1->buffering).hs[0].data[1] << 0x10 |
                            (uint)(pmVar1->buffering).hs[0].data[2] << 8 |
                           (uint)(pmVar1->buffering).hs[0].data[3]);
        if (0x400 < lVar4 + 0xcU) {
          mbedtls_debug_print_msg
                    (ssl,1,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                     ,0x10b1,"should never happen");
          return -0x6c00;
        }
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x10b5,"Next handshake message has been buffered - load");
        mbedtls_debug_print_buf
                  (ssl,3,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x10b7,"Buffered handshake message (incl. header)",
                   (pmVar1->buffering).hs[0].data,lVar4 + 0xc);
        ssl->in_msgtype = 0x16;
        ssl->in_hslen = lVar4 + 0xc;
        ssl->in_msglen = lVar4 + 0xc;
        memcpy(ssl->in_msg,(pmVar1->buffering).hs[0].data,ssl->in_hslen);
        msg_len._4_4_ = 0;
      }
      else {
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
                   ,0x10c2,"Next handshake message %u not or only partially bufffered",
                   (ulong)pmVar1->in_msg_seq);
        msg_len._4_4_ = -1;
      }
    }
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_msg.c"
               ,0x10c9,"<= ssl_load_buffered_message");
    ssl_local._4_4_ = msg_len._4_4_;
  }
  return ssl_local._4_4_;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_load_buffered_message(mbedtls_ssl_context *ssl)
{
    mbedtls_ssl_handshake_params * const hs = ssl->handshake;
    mbedtls_ssl_hs_buffer *hs_buf;
    int ret = 0;

    if (hs == NULL) {
        return -1;
    }

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> ssl_load_buffered_message"));

    if (ssl->state == MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC ||
        ssl->state == MBEDTLS_SSL_SERVER_CHANGE_CIPHER_SPEC) {
        /* Check if we have seen a ChangeCipherSpec before.
         * If yes, synthesize a CCS record. */
        if (!hs->buffering.seen_ccs) {
            MBEDTLS_SSL_DEBUG_MSG(2, ("CCS not seen in the current flight"));
            ret = -1;
            goto exit;
        }

        MBEDTLS_SSL_DEBUG_MSG(2, ("Injecting buffered CCS message"));
        ssl->in_msgtype = MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC;
        ssl->in_msglen = 1;
        ssl->in_msg[0] = 1;

        /* As long as they are equal, the exact value doesn't matter. */
        ssl->in_left            = 0;
        ssl->next_record_offset = 0;

        hs->buffering.seen_ccs = 0;
        goto exit;
    }

#if defined(MBEDTLS_DEBUG_C)
    /* Debug only */
    {
        unsigned offset;
        for (offset = 1; offset < MBEDTLS_SSL_MAX_BUFFERED_HS; offset++) {
            hs_buf = &hs->buffering.hs[offset];
            if (hs_buf->is_valid == 1) {
                MBEDTLS_SSL_DEBUG_MSG(2, ("Future message with sequence number %u %s buffered.",
                                          hs->in_msg_seq + offset,
                                          hs_buf->is_complete ? "fully" : "partially"));
            }
        }
    }
#endif /* MBEDTLS_DEBUG_C */

    /* Check if we have buffered and/or fully reassembled the
     * next handshake message. */
    hs_buf = &hs->buffering.hs[0];
    if ((hs_buf->is_valid == 1) && (hs_buf->is_complete == 1)) {
        /* Synthesize a record containing the buffered HS message. */
        size_t msg_len = (hs_buf->data[1] << 16) |
                         (hs_buf->data[2] << 8) |
                         hs_buf->data[3];

        /* Double-check that we haven't accidentally buffered
         * a message that doesn't fit into the input buffer. */
        if (msg_len + 12 > MBEDTLS_SSL_IN_CONTENT_LEN) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("should never happen"));
            return MBEDTLS_ERR_SSL_INTERNAL_ERROR;
        }

        MBEDTLS_SSL_DEBUG_MSG(2, ("Next handshake message has been buffered - load"));
        MBEDTLS_SSL_DEBUG_BUF(3, "Buffered handshake message (incl. header)",
                              hs_buf->data, msg_len + 12);

        ssl->in_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
        ssl->in_hslen   = msg_len + 12;
        ssl->in_msglen  = msg_len + 12;
        memcpy(ssl->in_msg, hs_buf->data, ssl->in_hslen);

        ret = 0;
        goto exit;
    } else {
        MBEDTLS_SSL_DEBUG_MSG(2, ("Next handshake message %u not or only partially bufffered",
                                  hs->in_msg_seq));
    }

    ret = -1;

exit:

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= ssl_load_buffered_message"));
    return ret;
}